

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

bool __thiscall
ON__LayerExtensions::Read(ON__LayerExtensions *this,ON_BinaryArchive *binary_archive)

{
  ON_SimpleArray<ON__LayerPerViewSettings> *this_00;
  bool bVar1;
  uint uVar2;
  ON_Layer *layer;
  ON__LayerPerViewSettings *pOVar3;
  int iVar4;
  byte bVar5;
  int count;
  int major_version;
  int minor_version;
  uint local_3c;
  int local_38 [2];
  
  if (-1 < (this->m_vp_settings).m_capacity) {
    (this->m_vp_settings).m_count = 0;
  }
  local_38[0] = 0;
  local_38[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(binary_archive,0x40008000,local_38,local_38 + 1);
  if (!bVar1) {
    return false;
  }
  layer = (ON_Layer *)ON_UserData::Owner(&this->super_ON_UserData);
  if (layer != (ON_Layer *)0x0) {
    bVar1 = ON_Object::IsKindOf((ON_Object *)layer,&ON_Layer::m_ON_Layer_class_rtti);
    bVar5 = 0;
    if ((!bVar1) || (bVar5 = 0, local_38[0] != 1)) goto LAB_004c00f9;
    local_3c = 0;
    bVar1 = ON_BinaryArchive::ReadInt(binary_archive,(ON__INT32 *)&local_3c);
    if (bVar1) {
      this_00 = &this->m_vp_settings;
      if ((uint)(this->m_vp_settings).m_capacity < local_3c) {
        ON_SimpleArray<ON__LayerPerViewSettings>::SetCapacity(this_00,(long)(int)local_3c);
      }
      bVar5 = 1;
      if (0 < (int)local_3c) {
        iVar4 = 0;
        do {
          pOVar3 = ON_SimpleArray<ON__LayerPerViewSettings>::AppendNew(this_00);
          bVar1 = ON__LayerPerViewSettings::Read(pOVar3,layer,binary_archive);
          uVar2 = (this->m_vp_settings).m_count;
          if (!bVar1) {
            (*this_00->_vptr_ON_SimpleArray[2])(this_00,(ulong)(uVar2 - 1));
            bVar5 = 0;
            break;
          }
          pOVar3 = (this->m_vp_settings).m_a + ((ulong)uVar2 - 1);
          if ((int)uVar2 < 1) {
            pOVar3 = (ON__LayerPerViewSettings *)0x0;
          }
          uVar2 = ON__LayerPerViewSettings::SettingsMask(pOVar3);
          if (uVar2 == 0) {
            (*(this->m_vp_settings)._vptr_ON_SimpleArray[2])
                      (this_00,(ulong)((this->m_vp_settings).m_count - 1));
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < (int)local_3c);
      }
      ON_SimpleArray<ON__LayerPerViewSettings>::QuickSort(this_00,ON__LayerPerViewSettings::Compare)
      ;
      goto LAB_004c00f9;
    }
  }
  bVar5 = 0;
LAB_004c00f9:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(binary_archive);
  return (bool)(bVar1 & bVar5);
}

Assistant:

bool ON__LayerExtensions::Read(ON_BinaryArchive& binary_archive)
{
  m_vp_settings.SetCount(0);

  int major_version = 0;
  int minor_version = 0;
  bool rc = binary_archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if ( !rc )
    return false;

  for(;;)
  {
    const ON_Layer* layer = ON_Layer::Cast( Owner() );
    rc = ( 0 != layer );
    if (!rc) break;

    rc = (1 == major_version);
    if (!rc) break;

    int count = 0;
    rc = binary_archive.ReadInt(&count);
    if ( !rc ) break;
    m_vp_settings.Reserve(count);
    for ( int i = 0; i < count; i++ )
    {
      rc = m_vp_settings.AppendNew().Read(*layer,binary_archive);
      if (!rc) 
      {
        m_vp_settings.Remove();
        break;
      }
      if ( 0 == m_vp_settings.Last()->SettingsMask() )
        m_vp_settings.Remove();
    }

    // to make ON_Layer::PerViewportSettingsCRC() return
    // equal values for equal settings, it is critical
    // that m_vp_settings[] be sorted.
    m_vp_settings.QuickSort(ON__LayerPerViewSettings::Compare);

    if (!rc) break;

    break;
  }

  if ( !binary_archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}